

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O3

LY_ERR lyd_parser_notif_eventtime_validate(lyd_node *node)

{
  ly_ctx *ctx;
  lysp_tpdf *plVar1;
  lysp_restr *patterns_p;
  ly_ctx *ctx_00;
  lysp_tpdf *plVar2;
  int iVar3;
  LY_ERR LVar4;
  LY_ERR LVar5;
  lys_module *plVar6;
  lys_module *plVar7;
  ulong uVar8;
  lysc_node *plVar9;
  lyd_node *plVar10;
  lysc_node *plVar11;
  size_t sVar12;
  lysp_tpdf *plVar13;
  lysc_pattern **pplVar14;
  lysc_pattern *plVar15;
  ulong uVar16;
  long lVar17;
  lysc_pattern **patterns;
  ly_err_item *err;
  lysc_ctx cctx;
  lysc_pattern **local_10e0;
  ly_err_item *local_10d8;
  lysc_ctx local_10d0;
  
  if (node->schema == (lysc_node *)0x0) {
    plVar6 = (lys_module *)&node[2].schema;
  }
  else {
    plVar6 = node->schema->module;
  }
  ctx = plVar6->ctx;
  memset(&local_10d0,0,0x10a0);
  local_10d8 = (ly_err_item *)0x0;
  local_10e0 = (lysc_pattern **)0x0;
  plVar6 = ly_ctx_get_module_implemented(ctx,"notifications");
  plVar7 = ly_ctx_get_module_latest(ctx,"ietf-yang-types");
  if (plVar7 == (lys_module *)0x0) {
    __assert_fail("mod2",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_common.c"
                  ,0x57,"LY_ERR lyd_parser_notif_eventtime_validate(const struct lyd_node *)");
  }
  if ((plVar6 != (lys_module *)0x0) || (plVar7->parsed == (lysp_module *)0x0)) {
    if (node->schema == (lysc_node *)0x0) {
      plVar6 = (lys_module *)&node[2].schema;
    }
    else {
      plVar6 = node->schema->module;
    }
    plVar9 = lys_find_path(plVar6->ctx,(lysc_node *)0x0,"/notifications:notification/eventTime",'\0'
                          );
    if (plVar9 == (lysc_node *)0x0) {
      return LY_ENOTFOUND;
    }
    plVar11 = node->schema;
    if (plVar11 == (lysc_node *)0x0) {
      plVar10 = node[1].prev;
LAB_00165879:
      plVar6 = (lys_module *)&node[2].schema;
    }
    else {
      if ((plVar11->nodetype & 0xc) == 0) {
        plVar10 = (lyd_node *)0x0;
      }
      else {
        plVar10 = *(lyd_node **)(node + 1);
        if (plVar10 == (lyd_node *)0x0) {
          plVar10 = (lyd_node *)
                    lyd_value_get_canonical(plVar11->module->ctx,(lyd_value *)(node + 1));
          plVar11 = node->schema;
          if (plVar11 == (lysc_node *)0x0) goto LAB_00165879;
        }
      }
      plVar6 = plVar11->module;
    }
    ctx_00 = plVar6->ctx;
    sVar12 = strlen((char *)plVar10);
    LVar4 = LY_SUCCESS;
    LVar5 = lyd_value_validate(ctx_00,plVar9,(char *)plVar10,sVar12,(lyd_node *)0x0,
                               (lysc_type **)0x0,(char **)0x0);
    if (LVar5 != LY_SUCCESS) {
      return LVar5;
    }
    goto LAB_001658e9;
  }
  local_10d0.path_len = 1;
  local_10d0.path[0] = '/';
  plVar1 = plVar7->parsed->typedefs;
  uVar16 = 0xffffffffffffffff;
  plVar2 = plVar1;
  local_10d0.ctx = ctx;
  local_10d0.free_ctx.ctx = ctx;
  do {
    plVar13 = plVar2;
    if (plVar1 == (lysp_tpdf *)0x0) {
      uVar8 = 0;
    }
    else {
      uVar8 = *(ulong *)&plVar1[-1].flags;
    }
    uVar16 = uVar16 + 1;
    if (uVar8 <= uVar16) {
      __assert_fail("type_p",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_common.c"
                    ,0x6b,"LY_ERR lyd_parser_notif_eventtime_validate(const struct lyd_node *)");
    }
    iVar3 = strcmp(plVar13->name,"date-and-time");
    plVar2 = plVar13 + 1;
  } while (iVar3 != 0);
  patterns_p = (plVar13->type).patterns;
  if (patterns_p == (lysp_restr *)0x0) {
    __assert_fail("type_p->patterns",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_common.c"
                  ,0x6e,"LY_ERR lyd_parser_notif_eventtime_validate(const struct lyd_node *)");
  }
  LVar4 = lys_compile_type_patterns(&local_10d0,patterns_p,(lysc_pattern **)0x0,&local_10e0);
  if (LVar4 != LY_SUCCESS) goto LAB_001658e9;
  if (node == (lyd_node *)0x0) {
LAB_001658bd:
    plVar10 = (lyd_node *)0x0;
  }
  else {
    plVar9 = node->schema;
    if (plVar9 == (lysc_node *)0x0) {
      plVar10 = node[1].prev;
    }
    else {
      if ((plVar9->nodetype & 0xc) == 0) goto LAB_001658bd;
      plVar10 = *(lyd_node **)(node + 1);
      if (plVar10 == (lyd_node *)0x0) {
        plVar10 = (lyd_node *)lyd_value_get_canonical(plVar9->module->ctx,(lyd_value *)(node + 1));
      }
    }
  }
  pplVar14 = local_10e0;
  sVar12 = strlen((char *)plVar10);
  LVar4 = lyplg_type_validate_patterns(pplVar14,(char *)plVar10,sVar12,&local_10d8);
LAB_001658e9:
  if (local_10e0 != (lysc_pattern **)0x0) {
    plVar15 = (lysc_pattern *)0xffffffffffffffff;
    lVar17 = 0;
    do {
      plVar15 = (lysc_pattern *)((long)&plVar15->expr + 1);
      if (local_10e0[-1] <= plVar15) {
        free(local_10e0 + -1);
        break;
      }
      pplVar14 = (lysc_pattern **)((long)local_10e0 + lVar17);
      lVar17 = lVar17 + 8;
      lysc_pattern_free(&local_10d0.free_ctx,pplVar14);
    } while (local_10e0 != (lysc_pattern **)0x0);
  }
  if (local_10d8 != (ly_err_item *)0x0 && LVar4 != LY_SUCCESS) {
    ly_err_print(ctx,local_10d8);
    ly_err_free(local_10d8);
    ly_vlog(ctx,(char *)0x0,LYVE_DATA,"Invalid \"eventTime\" in the notification.");
  }
  return LVar4;
}

Assistant:

LY_ERR
lyd_parser_notif_eventtime_validate(const struct lyd_node *node)
{
    LY_ERR rc = LY_SUCCESS;
    struct ly_ctx *ctx = (struct ly_ctx *)LYD_CTX(node);
    struct lysc_ctx cctx = {0};
    const struct lys_module *mod1, *mod2;
    const struct lysc_node *schema;
    LY_ARRAY_COUNT_TYPE u;
    struct ly_err_item *err = NULL;
    struct lysp_type *type_p = NULL;
    struct lysc_pattern **patterns = NULL;
    const char *value;

    /* find the used modules, we will either use a compiled leaf or compile the relevant type ourselves */
    mod1 = ly_ctx_get_module_implemented(ctx, "notifications");
    mod2 = ly_ctx_get_module_latest(ctx, "ietf-yang-types");
    assert(mod2);

    if (mod1 || !mod2->parsed) {
        /* get date-and-time leaf */
        schema = lys_find_path(LYD_CTX(node), NULL, "/notifications:notification/eventTime", 0);
        LY_CHECK_RET(!schema, LY_ENOTFOUND);

        /* validate the value */
        value = lyd_get_value(node);
        LY_CHECK_RET(lyd_value_validate(LYD_CTX(node), schema, value, strlen(value), NULL, NULL, NULL));
    } else {
        LYSC_CTX_INIT_CTX(cctx, ctx);

        /* get date-and-time parsed type */
        LY_ARRAY_FOR(mod2->parsed->typedefs, u) {
            if (!strcmp(mod2->parsed->typedefs[u].name, "date-and-time")) {
                type_p = &mod2->parsed->typedefs[u].type;
                break;
            }
        }
        assert(type_p);

        /* compile patterns */
        assert(type_p->patterns);
        LY_CHECK_GOTO(rc = lys_compile_type_patterns(&cctx, type_p->patterns, NULL, &patterns), cleanup);

        /* validate */
        value = lyd_get_value(node);
        rc = lyplg_type_validate_patterns(patterns, value, strlen(value), &err);
    }

cleanup:
    FREE_ARRAY(&cctx.free_ctx, patterns, lysc_pattern_free);
    if (rc && err) {
        ly_err_print(ctx, err);
        ly_err_free(err);
        LOGVAL(ctx, LYVE_DATA, "Invalid \"eventTime\" in the notification.");
    }
    return rc;
}